

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

double array_min(double *array,int N)

{
  double local_20;
  double m;
  int i;
  int N_local;
  double *array_local;
  
  local_20 = *array;
  for (m._0_4_ = 1; m._0_4_ < N; m._0_4_ = m._0_4_ + 1) {
    if (array[m._0_4_] < local_20) {
      local_20 = array[m._0_4_];
    }
  }
  return local_20;
}

Assistant:

double array_min(double *array,int N) {
	int i;
	double m = array[0];
	for (i = 1; i < N;++i) {
		if (array[i] < m ) {
			m = array[i];
			}
	}

	return m;
}